

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::getTopHelp(QPDFArgParser *this,ostringstream *msg)

{
  element_type *peVar1;
  ostream *poVar2;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"Run \"",5);
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)msg,(peVar1->whoami)._M_dataplus._M_p,
                      (peVar1->whoami)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," --help=topic\" for help on a topic.",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run \"",5);
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(peVar1->whoami)._M_dataplus._M_p,(peVar1->whoami)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," --help=--option\" for help on an option.",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run \"",5);
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(peVar1->whoami)._M_dataplus._M_p,(peVar1->whoami)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," --help=all\" to see all available help.",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Topics:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (p_Var4 = *(_Base_ptr *)
                 ((long)&(peVar1->help_topics)._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var4 != &(peVar1->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"  ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)msg,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var4 + 2),(long)p_Var4[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void
QPDFArgParser::getTopHelp(std::ostringstream& msg)
{
    msg << "Run \"" << m->whoami << " --help=topic\" for help on a topic." << std::endl
        << "Run \"" << m->whoami << " --help=--option\" for help on an option." << std::endl
        << "Run \"" << m->whoami << " --help=all\" to see all available help." << std::endl
        << std::endl
        << "Topics:" << std::endl;
    for (auto const& i: m->help_topics) {
        msg << "  " << i.first << ": " << i.second.short_text << std::endl;
    }
}